

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

uhugeint_t __thiscall
duckdb::VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric>::
Operation<duckdb::string_t,duckdb::uhugeint_t>
          (VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric> *this,string_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  string *psVar1;
  bool bVar2;
  uhugeint_t *result;
  uhugeint_t uVar3;
  string_t input_00;
  string_t input_01;
  uhugeint_t output;
  uhugeint_t local_58;
  string local_48;
  
  input_01.value._0_8_ = input.value._0_8_;
  result = *(uhugeint_t **)(idx + 8);
  input_01.value.pointer.ptr = (char *)&local_58;
  bVar2 = CastFromBitToNumeric::Operation<duckdb::string_t,duckdb::uhugeint_t>
                    ((CastFromBitToNumeric *)this,input_01,result,(CastParameters *)idx);
  if (!bVar2) {
    psVar1 = *(string **)(*(long *)(idx + 8) + 0x10);
    if ((psVar1 == (string *)0x0) || (*(long *)(psVar1 + 8) == 0)) {
      input_00.value.pointer.ptr = (char *)result;
      input_00.value._0_8_ = input_01.value._0_8_;
      CastExceptionText<duckdb::string_t,duckdb::uhugeint_t>(&local_48,(duckdb *)this,input_00);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_48,psVar1);
    }
    uVar3 = HandleVectorCastError::Operation<duckdb::uhugeint_t>
                      (&local_48,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_48);
    local_58 = uVar3;
  }
  return local_58;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters))) {
			return output;
		}
		bool has_error = data->parameters.error_message && !data->parameters.error_message->empty();
		return HandleVectorCastError::Operation<RESULT_TYPE>(
		    has_error ? *data->parameters.error_message : CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask, idx,
		    *data);
	}